

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ternary_executor.hpp
# Opt level: O3

idx_t duckdb::TernaryExecutor::
      SelectLoopSelSwitch<duckdb::uhugeint_t,duckdb::uhugeint_t,duckdb::uhugeint_t,duckdb::UpperInclusiveBetweenOperator,true>
                (UnifiedVectorFormat *adata,UnifiedVectorFormat *bdata,UnifiedVectorFormat *cdata,
                SelectionVector *sel,idx_t count,SelectionVector *true_sel,
                SelectionVector *false_sel)

{
  SelectionVector *pSVar1;
  data_ptr_t pdVar2;
  SelectionVector *pSVar3;
  data_ptr_t pdVar4;
  SelectionVector *pSVar5;
  data_ptr_t pdVar6;
  bool bVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  idx_t iVar12;
  ulong uVar13;
  ulong uVar14;
  uhugeint_t local_68;
  uhugeint_t local_58;
  uhugeint_t local_48;
  
  pSVar1 = adata->sel;
  pdVar2 = adata->data;
  pSVar3 = bdata->sel;
  pdVar4 = bdata->data;
  pSVar5 = cdata->sel;
  pdVar6 = cdata->data;
  if (false_sel == (SelectionVector *)0x0 || true_sel == (SelectionVector *)0x0) {
    if (true_sel == (SelectionVector *)0x0) {
      lVar11 = 0;
      if (count != 0) {
        uVar14 = 0;
        do {
          uVar13 = uVar14;
          if (sel->sel_vector != (sel_t *)0x0) {
            uVar13 = (ulong)sel->sel_vector[uVar14];
          }
          uVar9 = uVar14;
          if (pSVar1->sel_vector != (sel_t *)0x0) {
            uVar9 = (ulong)pSVar1->sel_vector[uVar14];
          }
          uVar8 = uVar14;
          if (pSVar3->sel_vector != (sel_t *)0x0) {
            uVar8 = (ulong)pSVar3->sel_vector[uVar14];
          }
          uVar10 = uVar14;
          if (pSVar5->sel_vector != (sel_t *)0x0) {
            uVar10 = (ulong)pSVar5->sel_vector[uVar14];
          }
          local_68.lower = *(uint64_t *)(pdVar2 + uVar9 * 0x10);
          local_68.upper = *(uint64_t *)((long)(pdVar2 + uVar9 * 0x10) + 8);
          local_48.lower = *(uint64_t *)(pdVar4 + uVar8 * 0x10);
          local_48.upper = *(uint64_t *)((long)(pdVar4 + uVar8 * 0x10) + 8);
          local_58.lower = *(uint64_t *)(pdVar6 + uVar10 * 0x10);
          local_58.upper = *(uint64_t *)((long)(pdVar6 + uVar10 * 0x10) + 8);
          bVar7 = uhugeint_t::operator>(&local_68,&local_48);
          uVar9 = 1;
          if (bVar7) {
            bVar7 = uhugeint_t::operator>(&local_68,&local_58);
            uVar9 = (ulong)bVar7;
          }
          false_sel->sel_vector[lVar11] = (sel_t)uVar13;
          lVar11 = lVar11 + uVar9;
          uVar14 = uVar14 + 1;
        } while (count != uVar14);
      }
      return count - lVar11;
    }
    if (count != 0) {
      iVar12 = 0;
      uVar14 = 0;
      do {
        uVar13 = uVar14;
        if (sel->sel_vector != (sel_t *)0x0) {
          uVar13 = (ulong)sel->sel_vector[uVar14];
        }
        uVar9 = uVar14;
        if (pSVar1->sel_vector != (sel_t *)0x0) {
          uVar9 = (ulong)pSVar1->sel_vector[uVar14];
        }
        uVar8 = uVar14;
        if (pSVar3->sel_vector != (sel_t *)0x0) {
          uVar8 = (ulong)pSVar3->sel_vector[uVar14];
        }
        uVar10 = uVar14;
        if (pSVar5->sel_vector != (sel_t *)0x0) {
          uVar10 = (ulong)pSVar5->sel_vector[uVar14];
        }
        local_68.lower = *(uint64_t *)(pdVar2 + uVar9 * 0x10);
        local_68.upper = *(uint64_t *)((long)(pdVar2 + uVar9 * 0x10) + 8);
        local_48.lower = *(uint64_t *)(pdVar4 + uVar8 * 0x10);
        local_48.upper = *(uint64_t *)((long)(pdVar4 + uVar8 * 0x10) + 8);
        local_58.lower = *(uint64_t *)(pdVar6 + uVar10 * 0x10);
        local_58.upper = *(uint64_t *)((long)(pdVar6 + uVar10 * 0x10) + 8);
        bVar7 = uhugeint_t::operator>(&local_68,&local_48);
        if (bVar7) {
          bVar7 = uhugeint_t::operator>(&local_68,&local_58);
          uVar9 = (ulong)!bVar7;
        }
        else {
          uVar9 = 0;
        }
        true_sel->sel_vector[iVar12] = (sel_t)uVar13;
        iVar12 = iVar12 + uVar9;
        uVar14 = uVar14 + 1;
      } while (count != uVar14);
      return iVar12;
    }
  }
  else if (count != 0) {
    iVar12 = 0;
    lVar11 = 0;
    uVar14 = 0;
    do {
      uVar13 = uVar14;
      if (sel->sel_vector != (sel_t *)0x0) {
        uVar13 = (ulong)sel->sel_vector[uVar14];
      }
      uVar9 = uVar14;
      if (pSVar1->sel_vector != (sel_t *)0x0) {
        uVar9 = (ulong)pSVar1->sel_vector[uVar14];
      }
      uVar8 = uVar14;
      if (pSVar3->sel_vector != (sel_t *)0x0) {
        uVar8 = (ulong)pSVar3->sel_vector[uVar14];
      }
      uVar10 = uVar14;
      if (pSVar5->sel_vector != (sel_t *)0x0) {
        uVar10 = (ulong)pSVar5->sel_vector[uVar14];
      }
      local_68.lower = *(uint64_t *)(pdVar2 + uVar9 * 0x10);
      local_68.upper = *(uint64_t *)((long)(pdVar2 + uVar9 * 0x10) + 8);
      local_48.lower = *(uint64_t *)(pdVar4 + uVar8 * 0x10);
      local_48.upper = *(uint64_t *)((long)(pdVar4 + uVar8 * 0x10) + 8);
      local_58.lower = *(uint64_t *)(pdVar6 + uVar10 * 0x10);
      local_58.upper = *(uint64_t *)((long)(pdVar6 + uVar10 * 0x10) + 8);
      bVar7 = uhugeint_t::operator>(&local_68,&local_48);
      if (bVar7) {
        bVar7 = uhugeint_t::operator>(&local_68,&local_58);
        bVar7 = !bVar7;
      }
      else {
        bVar7 = false;
      }
      true_sel->sel_vector[iVar12] = (sel_t)uVar13;
      iVar12 = iVar12 + bVar7;
      false_sel->sel_vector[lVar11] = (sel_t)uVar13;
      lVar11 = lVar11 + (ulong)(bVar7 ^ 1);
      uVar14 = uVar14 + 1;
    } while (count != uVar14);
    return iVar12;
  }
  return 0;
}

Assistant:

static inline idx_t SelectLoopSelSwitch(UnifiedVectorFormat &adata, UnifiedVectorFormat &bdata,
	                                        UnifiedVectorFormat &cdata, const SelectionVector *sel, idx_t count,
	                                        SelectionVector *true_sel, SelectionVector *false_sel) {
		if (true_sel && false_sel) {
			return SelectLoop<A_TYPE, B_TYPE, C_TYPE, OP, NO_NULL, true, true>(
			    UnifiedVectorFormat::GetData<A_TYPE>(adata), UnifiedVectorFormat::GetData<B_TYPE>(bdata),
			    UnifiedVectorFormat::GetData<C_TYPE>(cdata), sel, count, *adata.sel, *bdata.sel, *cdata.sel,
			    adata.validity, bdata.validity, cdata.validity, true_sel, false_sel);
		} else if (true_sel) {
			return SelectLoop<A_TYPE, B_TYPE, C_TYPE, OP, NO_NULL, true, false>(
			    UnifiedVectorFormat::GetData<A_TYPE>(adata), UnifiedVectorFormat::GetData<B_TYPE>(bdata),
			    UnifiedVectorFormat::GetData<C_TYPE>(cdata), sel, count, *adata.sel, *bdata.sel, *cdata.sel,
			    adata.validity, bdata.validity, cdata.validity, true_sel, false_sel);
		} else {
			D_ASSERT(false_sel);
			return SelectLoop<A_TYPE, B_TYPE, C_TYPE, OP, NO_NULL, false, true>(
			    UnifiedVectorFormat::GetData<A_TYPE>(adata), UnifiedVectorFormat::GetData<B_TYPE>(bdata),
			    UnifiedVectorFormat::GetData<C_TYPE>(cdata), sel, count, *adata.sel, *bdata.sel, *cdata.sel,
			    adata.validity, bdata.validity, cdata.validity, true_sel, false_sel);
		}
	}